

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::register_control_dependent_expression(CompilerGLSL *this,uint32_t expr)

{
  SPIRBlock *pSVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> TVar3;
  iterator iVar4;
  TypedID<(spirv_cross::Types)0> local_14;
  
  local_14.id = expr;
  iVar4 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->super_Compiler).forwarded_temporaries._M_h,&local_14.id);
  TVar3.id = local_14.id;
  if (iVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    pSVar1 = this->current_emitting_block;
    if (pSVar1 == (SPIRBlock *)0x0) {
      __assert_fail("current_emitting_block",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x2429,
                    "void spirv_cross::CompilerGLSL::register_control_dependent_expression(uint32_t)"
                   );
    }
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::reserve
              (&pSVar1->invalidate_expressions,
               (pSVar1->invalidate_expressions).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size + 1);
    sVar2 = (pSVar1->invalidate_expressions).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    (pSVar1->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
    ptr[sVar2].id = TVar3.id;
    (pSVar1->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
    buffer_size = sVar2 + 1;
  }
  return;
}

Assistant:

void CompilerGLSL::register_control_dependent_expression(uint32_t expr)
{
	if (forwarded_temporaries.find(expr) == end(forwarded_temporaries))
		return;

	assert(current_emitting_block);
	current_emitting_block->invalidate_expressions.push_back(expr);
}